

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

VarnodeTpl * __thiscall PcodeCompile::buildTemporary(PcodeCompile *this)

{
  int iVar1;
  VarnodeTpl *this_00;
  undefined4 extraout_var;
  ConstTpl local_88;
  ConstTpl local_68;
  ConstTpl local_38;
  VarnodeTpl *local_18;
  VarnodeTpl *res;
  PcodeCompile *this_local;
  
  res = (VarnodeTpl *)this;
  this_00 = (VarnodeTpl *)operator_new(0x68);
  ConstTpl::ConstTpl(&local_38,this->uniqspace);
  iVar1 = (**this->_vptr_PcodeCompile)();
  ConstTpl::ConstTpl(&local_68,real,CONCAT44(extraout_var,iVar1));
  ConstTpl::ConstTpl(&local_88,real,0);
  VarnodeTpl::VarnodeTpl(this_00,&local_38,&local_68,&local_88);
  local_18 = this_00;
  VarnodeTpl::setUnnamed(this_00,true);
  return local_18;
}

Assistant:

VarnodeTpl *PcodeCompile::buildTemporary(void)

{				// Build temporary variable (with zerosize)
  VarnodeTpl *res = new VarnodeTpl(ConstTpl(uniqspace),
				   ConstTpl(ConstTpl::real,allocateTemp()),
				   ConstTpl(ConstTpl::real,0));
  res->setUnnamed(true);
  return res;
}